

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taiwncal.cpp
# Opt level: O0

int32_t __thiscall icu_63::TaiwanCalendar::handleGetExtendedYear(TaiwanCalendar *this)

{
  UCalendarDateFields UVar1;
  int32_t iVar2;
  int32_t local_14;
  int32_t era;
  int32_t year;
  TaiwanCalendar *this_local;
  
  local_14 = 0x7b2;
  UVar1 = Calendar::newerField((Calendar *)this,UCAL_EXTENDED_YEAR,UCAL_YEAR);
  if ((UVar1 == UCAL_EXTENDED_YEAR) &&
     (UVar1 = Calendar::newerField((Calendar *)this,UCAL_EXTENDED_YEAR,UCAL_ERA),
     UVar1 == UCAL_EXTENDED_YEAR)) {
    local_14 = Calendar::internalGet((Calendar *)this,UCAL_EXTENDED_YEAR,0x7b2);
  }
  else {
    iVar2 = Calendar::internalGet((Calendar *)this,UCAL_ERA,1);
    if (iVar2 == 1) {
      local_14 = Calendar::internalGet((Calendar *)this,UCAL_YEAR,1);
      local_14 = local_14 + 0x777;
    }
    else if (iVar2 == 0) {
      local_14 = Calendar::internalGet((Calendar *)this,UCAL_YEAR,1);
      local_14 = 0x778 - local_14;
    }
  }
  return local_14;
}

Assistant:

int32_t TaiwanCalendar::handleGetExtendedYear()
{
    // EXTENDED_YEAR in TaiwanCalendar is a Gregorian year
    // The default value of EXTENDED_YEAR is 1970 (Minguo 59)
    int32_t year = kGregorianEpoch;

    if (newerField(UCAL_EXTENDED_YEAR, UCAL_YEAR) == UCAL_EXTENDED_YEAR
        && newerField(UCAL_EXTENDED_YEAR, UCAL_ERA) == UCAL_EXTENDED_YEAR) {
        year = internalGet(UCAL_EXTENDED_YEAR, kGregorianEpoch);
    } else {
        int32_t era = internalGet(UCAL_ERA, MINGUO);
        if(era == MINGUO) {
            year =     internalGet(UCAL_YEAR, 1) + kTaiwanEraStart;
        } else if(era == BEFORE_MINGUO) {
            year = 1 - internalGet(UCAL_YEAR, 1) + kTaiwanEraStart;
        }
    }
    return year;
}